

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestsupport_gui.cpp
# Opt level: O0

void QtGuiTest::setKeyboardModifiers(KeyboardModifiers modifiers)

{
  long lVar1;
  bool bVar2;
  QLoggingCategory *cat;
  QDebug *o;
  int in_EDI;
  long in_FS_OFFSET;
  QInputDeviceManager *idm;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffa8;
  QFlagsStorage<Qt::KeyboardModifier> in_stack_ffffffffffffffac;
  QMessageLogger *in_stack_ffffffffffffffb0;
  QDebug *in_stack_ffffffffffffffb8;
  QDebug in_stack_ffffffffffffffc8;
  QDebug local_30;
  QFlagsStorage<Qt::KeyboardModifier> in_stack_ffffffffffffffdc;
  char *t;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  cat = (QLoggingCategory *)inputDeviceManager();
  if (cat != (QLoggingCategory *)0x0) {
    QInputDeviceManager::setKeyboardModifiers
              ((QInputDeviceManager *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               (KeyboardModifiers)in_stack_ffffffffffffffac.i);
    t = &DAT_aaaaaaaaaaaaaaaa;
    lcQtGuiTest();
    anon_unknown.dwarf_91466c::QLoggingCategoryMacroHolder<(QtMsgType)0>::
    QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),cat);
    while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&stack0xffffffffffffffe8), bVar2) {
      anon_unknown.dwarf_91466c::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x423ef8);
      QMessageLogger::QMessageLogger
                (in_stack_ffffffffffffffb0,
                 (char *)CONCAT44(in_stack_ffffffffffffffac.i,in_stack_ffffffffffffffa8),
                 in_stack_ffffffffffffffa4,(char *)cat,(char *)0x423f0e);
      QMessageLogger::debug();
      o = QDebug::operator<<(in_stack_ffffffffffffffb8,t);
      QDebug::QDebug(&local_30,o);
      in_stack_ffffffffffffffa4 = in_EDI;
      operator<<<QFlags<Qt::KeyboardModifier>,_true>
                ((QDebug *)in_stack_ffffffffffffffc8.stream,
                 (QFlags<Qt::KeyboardModifier>)in_stack_ffffffffffffffdc.i);
      QDebug::~QDebug((QDebug *)&stack0xffffffffffffffd8);
      QDebug::~QDebug(&local_30);
      QDebug::~QDebug((QDebug *)&stack0xffffffffffffffc8);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QtGuiTest::setKeyboardModifiers(Qt::KeyboardModifiers modifiers)
{
    auto *idm = inputDeviceManager();
    if (Q_UNLIKELY(!idm))
        return;

    idm->setKeyboardModifiers(modifiers);
    deb << "Keyboard modifiers synthesized:" << modifiers;
}